

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O3

uint32 re2::Prog::EmptyFlags(StringPiece *text,char *p)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  
  pcVar3 = text->ptr_;
  if (pcVar3 == p) {
    pcVar7 = pcVar3 + text->length_;
    uVar4 = 5;
    if (pcVar7 == p) {
      uVar5 = 0xf;
      goto LAB_0012c2e7;
    }
  }
  else {
    bVar1 = p[-1];
    uVar4 = (uint)(bVar1 == 10);
    pcVar7 = pcVar3 + text->length_;
    if (pcVar7 == p) {
      uVar4 = (uint)((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) << 4 | 10;
      if ((byte)(bVar1 - 0x30) < 10) {
        uVar4 = 0x1a;
      }
      if (bVar1 == 0x5f) {
        uVar4 = 0x1a;
      }
      uVar5 = uVar4 | bVar1 == 10;
      goto LAB_0012c2e7;
    }
  }
  if ((p < pcVar7) && (*p == '\n')) {
    uVar4 = uVar4 | 2;
  }
  if (pcVar3 == p) {
    bVar1 = *p;
    uVar6 = uVar4 + 0x10;
    if ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) {
      uVar4 = uVar6;
    }
    if ((byte)(bVar1 - 0x30) < 10) {
      uVar4 = uVar6;
    }
    uVar5 = uVar4;
    if (bVar1 == 0x5f) {
      uVar5 = uVar6;
    }
  }
  else {
    bVar1 = p[-1];
    bVar2 = *p;
    uVar5 = uVar4 + 0x10;
    if (((bVar2 == 0x5f || (byte)(bVar2 - 0x30) < 10) || (byte)((bVar2 & 0xdf) + 0xbf) < 0x1a) ==
        ((bVar1 == 0x5f || (byte)(bVar1 - 0x30) < 10) || (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
      uVar5 = uVar4;
    }
  }
LAB_0012c2e7:
  return ~uVar5 * 2 & 0x20 | uVar5;
}

Assistant:

iterator end() const { return ptr_ + length_; }